

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::option_not_has_argument_exception::~option_not_has_argument_exception
          (option_not_has_argument_exception *this)

{
  OptionException::~OptionException((OptionException *)this);
  operator_delete(this);
  return;
}

Assistant:

option_not_has_argument_exception
    (
      const std::string& option,
      const std::string& arg
    )
    : OptionParseException(
        u8"Option ‘" + option + u8"’ does not take an argument, but argument‘"
        + arg + "’ given")
    {
    }